

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double-conversion-bignum.cpp
# Opt level: O3

void __thiscall icu_63::double_conversion::Bignum::AddBignum(Bignum *this,Bignum *other)

{
  int iVar1;
  int iVar2;
  uint *puVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  uint *puVar7;
  int iVar8;
  long lVar9;
  uint uVar10;
  
  Align(this,other);
  iVar2 = this->exponent_;
  iVar8 = this->used_digits_ + iVar2;
  iVar1 = other->exponent_ + other->used_digits_;
  if (iVar8 <= iVar1) {
    iVar8 = iVar1;
  }
  if ((iVar8 - iVar2) + 1 < 0x81) {
    uVar4 = other->exponent_ - iVar2;
    if (0 < other->used_digits_) {
      puVar7 = (other->bigits_).start_;
      puVar3 = (this->bigits_).start_;
      lVar9 = 0;
      uVar6 = 0;
      do {
        uVar10 = uVar6 + puVar3[(int)uVar4 + lVar9] + puVar7[lVar9];
        puVar3[(int)uVar4 + lVar9] = uVar10 & 0xfffffff;
        uVar6 = uVar10 >> 0x1c;
        lVar9 = lVar9 + 1;
      } while (lVar9 < other->used_digits_);
      uVar5 = (ulong)uVar4 + lVar9;
      uVar4 = (uint)uVar5;
      if (0xfffffff < uVar10) {
        puVar7 = (this->bigits_).start_ + (int)uVar4;
        do {
          uVar10 = uVar6 + *puVar7;
          *puVar7 = uVar10 & 0xfffffff;
          uVar6 = uVar10 >> 0x1c;
          puVar7 = puVar7 + 1;
          uVar4 = (int)uVar5 + 1;
          uVar5 = (ulong)uVar4;
        } while (0xfffffff < uVar10);
      }
    }
    uVar6 = this->used_digits_;
    if (this->used_digits_ < (int)uVar4) {
      uVar6 = uVar4;
    }
    this->used_digits_ = uVar6;
    return;
  }
  abort();
}

Assistant:

void Bignum::AddBignum(const Bignum& other) {
  ASSERT(IsClamped());
  ASSERT(other.IsClamped());

  // If this has a greater exponent than other append zero-bigits to this.
  // After this call exponent_ <= other.exponent_.
  Align(other);

  // There are two possibilities:
  //   aaaaaaaaaaa 0000  (where the 0s represent a's exponent)
  //     bbbbb 00000000
  //   ----------------
  //   ccccccccccc 0000
  // or
  //    aaaaaaaaaa 0000
  //  bbbbbbbbb 0000000
  //  -----------------
  //  cccccccccccc 0000
  // In both cases we might need a carry bigit.

  EnsureCapacity(1 + Max(BigitLength(), other.BigitLength()) - exponent_);
  Chunk carry = 0;
  int bigit_pos = other.exponent_ - exponent_;
  ASSERT(bigit_pos >= 0);
  for (int i = 0; i < other.used_digits_; ++i) {
    Chunk sum = bigits_[bigit_pos] + other.bigits_[i] + carry;
    bigits_[bigit_pos] = sum & kBigitMask;
    carry = sum >> kBigitSize;
    bigit_pos++;
  }

  while (carry != 0) {
    Chunk sum = bigits_[bigit_pos] + carry;
    bigits_[bigit_pos] = sum & kBigitMask;
    carry = sum >> kBigitSize;
    bigit_pos++;
  }
  used_digits_ = Max(bigit_pos, used_digits_);
  ASSERT(IsClamped());
}